

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O3

void __thiscall Costs::linReg(Costs *this,double *coeff,double *gtT,uint t,uint n)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  uVar2 = n + 1;
  dVar7 = 0.0;
  dVar6 = 0.0;
  if (t + 2 < uVar2) {
    uVar3 = (ulong)(t + 2);
    iVar5 = ~t + n;
    do {
      dVar6 = dVar6 + gtT[uVar3];
      dVar7 = dVar7 + (double)(uVar3 & 0xffffffff) * gtT[uVar3];
      uVar3 = uVar3 + 1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  uVar4 = n - t;
  dVar9 = (double)(uVar4 + 1) * (double)(uVar4 - 1) * (double)uVar4;
  dVar10 = ((double)(uVar2 + t) * -6.0) / dVar9;
  dVar8 = dVar10 * dVar6 + (12.0 / dVar9) * dVar7;
  dVar6 = (((double)(uVar2 + t) * 3.0) / dVar9 + 1.0 / (double)uVar4) * dVar6 + dVar10 * dVar7;
  dVar7 = 0.0;
  dVar9 = 0.0;
  if (t + 1 < uVar2) {
    uVar3 = (ulong)(t + 1);
    dVar7 = 0.0;
    dVar9 = 0.0;
    do {
      dVar10 = gtT[uVar3] - ((double)(uVar3 & 0xffffffff) * dVar8 + dVar6);
      dVar7 = (double)(~-(ulong)(dVar10 < dVar7) & (ulong)dVar7 |
                      (ulong)dVar10 & -(ulong)(dVar10 < dVar7));
      dVar9 = (double)(~-(ulong)(dVar9 < dVar10) & (ulong)dVar9 |
                      (ulong)dVar10 & -(ulong)(dVar9 < dVar10));
      uVar3 = uVar3 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  *coeff = dVar8;
  coeff[1] = dVar8;
  auVar1._8_4_ = SUB84(dVar6 + dVar9,0);
  auVar1._0_8_ = dVar6 + dVar7;
  auVar1._12_4_ = (int)((ulong)(dVar6 + dVar9) >> 0x20);
  *(undefined1 (*) [16])(coeff + 2) = auVar1;
  return;
}

Assistant:

void Costs::linReg(double* coeff, double *gtT, unsigned int t, unsigned int n)
{
  double sum_gtT = 0;
  double sum_igtT = 0;
  for(unsigned int i = t + 2; i < n + 1; i++) // 0 in t + 1
  {
    sum_gtT = sum_gtT + gtT[i];
    sum_igtT = sum_igtT + i * gtT[i];
  }
  double prod3 = 1.0*(n-t)*(n-t-1)*(n-t+1);
  double sum3 = 1.0*(n+t+1);

  double slope = (-6*sum3/prod3)*sum_gtT + (12/prod3)*sum_igtT;
  double intercept =((1/(1.0*(n-t))) + 3*sum3/prod3)*sum_gtT - (6*sum3/prod3)*sum_igtT;

  double residuMax = 0;
  double residuMin = 0;

  for(unsigned int i = t + 1; i < n + 1; i++) // 0 in t + 1
  {
    if(gtT[i] - (slope*i + intercept) > residuMax){residuMax = gtT[i] - (slope*i + intercept);}
    if(gtT[i] - (slope*i + intercept) < residuMin){residuMin = gtT[i] - (slope*i + intercept);}
  }

  ///matrix of coefficients: Ap, Am, Gp, Gm
  coeff[0] = slope;
  coeff[1] = slope;
  coeff[2] = intercept + residuMin;
  coeff[3] = intercept + residuMax;
}